

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O0

void __thiscall rtosc::AutomationMgr::setparameternumber(AutomationMgr *this,uint type,int value)

{
  int value_local;
  uint type_local;
  AutomationMgr *this_local;
  
  if (type == 6) {
    if ((-1 < (this->NRPN).parhi) && (-1 < (this->NRPN).parlo)) {
      (this->NRPN).valhi = value;
    }
  }
  else if (type == 0x26) {
    if ((-1 < (this->NRPN).parhi) && (-1 < (this->NRPN).parlo)) {
      (this->NRPN).vallo = value;
    }
  }
  else if (type == 0x62) {
    (this->NRPN).parlo = value;
    (this->NRPN).valhi = -1;
    (this->NRPN).vallo = -1;
  }
  else if (type == 99) {
    (this->NRPN).parhi = value;
    (this->NRPN).valhi = -1;
    (this->NRPN).vallo = -1;
  }
  return;
}

Assistant:

void AutomationMgr::setparameternumber(unsigned int type, int value)
{
    switch(type) {
        case C_nrpnhi:
            NRPN.parhi = value;
            NRPN.valhi = -1;
            NRPN.vallo = -1; //clear the values
            break;
        case C_nrpnlo:
            NRPN.parlo = value;
            NRPN.valhi = -1;
            NRPN.vallo = -1; //clear the values
            break;
        case C_dataentryhi:
            if((NRPN.parhi >= 0) && (NRPN.parlo >= 0))
                NRPN.valhi = value;
            break;
        case C_dataentrylo:
            if((NRPN.parhi >= 0) && (NRPN.parlo >= 0))
                NRPN.vallo = value;
            break;
    }
}